

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_collective.cpp
# Opt level: O2

void __thiscall
MxxColl_AllgatherGeneral_Test::~MxxColl_AllgatherGeneral_Test(MxxColl_AllgatherGeneral_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MxxColl, AllgatherGeneral) {
    mxx::comm c;

    size_t size = 13;
    std::vector<unsigned> els(size);
    for (size_t i = 0; i < size; ++i) {
        els[i] = i*3*c.rank();
    }

    std::vector<unsigned> all;
    all.resize(13*c.size());
    // test general function
    mxx::allgather(&els[0], size, &all[0], c);
    for (int i = 0; i < c.size(); ++i) {
        for (int j = 0; j < (int)size; ++j) {
            ASSERT_EQ((unsigned)j*3*i, all[i*size + j]);
        }
    }

    // test convenience functions
    all = mxx::allgather(&els[0], size, MPI_COMM_WORLD);
    ASSERT_EQ(size*c.size(), all.size());
    for (int i = 0; i < c.size(); ++i) {
        for (int j = 0; j < (int)size; ++j) {
            ASSERT_EQ((unsigned)j*3*i, all[i*size + j]);
        }
    }
    // test convenience functions
    all = mxx::allgather(els);
    ASSERT_EQ(size*c.size(), all.size());
    for (int i = 0; i < c.size(); ++i) {
        for (int j = 0; j < (int)size; ++j) {
            ASSERT_EQ((unsigned)j*3*i, all[i*size + j]);
        }
    }
}